

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::IsDiagonal(Matrix *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fraction local_38;
  
  iVar4 = this->n_;
  if (0 < iVar4) {
    iVar3 = this->m_;
    lVar6 = 0;
    do {
      if (0 < iVar3) {
        lVar5 = 0;
        lVar7 = 0;
        do {
          if (lVar6 != lVar7) {
            lVar1 = *(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar6].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data;
            Fraction::Fraction(&local_38,0);
            bVar2 = operator!=((Fraction *)(lVar1 + lVar5),&local_38);
            if (bVar2) {
              return false;
            }
            iVar3 = this->m_;
          }
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar7 < iVar3);
        iVar4 = this->n_;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  return true;
}

Assistant:

bool Matrix::IsDiagonal() const {
  for (int row = 0; row < n_; ++row) {
    for (int column = 0; column < m_; ++column) {
      if (row != column && elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}